

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_exception(TCGContext_conflict12 *tcg_ctx,int excp)

{
  TCGv_i32 arg2;
  TCGv_i32 tmp;
  int excp_local;
  TCGContext_conflict12 *tcg_ctx_local;
  
  arg2 = tcg_const_i32_s390x(tcg_ctx,excp);
  gen_helper_exception(tcg_ctx,tcg_ctx->cpu_env,arg2);
  tcg_temp_free_i32(tcg_ctx,arg2);
  return;
}

Assistant:

static void gen_exception(DisasContext *s, int trapno, target_ulong cur_eip)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    gen_update_cc_op(s);
    gen_jmp_im(s, cur_eip);
    gen_helper_raise_exception(tcg_ctx, tcg_ctx->cpu_env, tcg_const_i32(tcg_ctx, trapno));
    s->base.is_jmp = DISAS_NORETURN;
}